

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveRight4update
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *forest,int *forestNum,int *forestIdx)

{
  bool bVar1;
  long in_RCX;
  double in_RDX;
  int *in_RSI;
  double *in_RDI;
  int *in_R8;
  int in_R9D;
  int *in_XMM0_Qa;
  CLUFactor<double> *unaff_retaddr;
  int *rperm_1;
  int *in_stack_00000010;
  int k_1;
  int j_1;
  int i_1;
  double x_1;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  double x;
  double in_stack_ffffffffffffff80;
  double a;
  int local_70;
  int local_6c;
  undefined8 local_68;
  double *local_60;
  double local_58;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int *local_30;
  long local_28;
  int iVar2;
  double *vec_00;
  
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  vec_00 = in_RDI;
  vSolveLright(unaff_retaddr,in_RDI,in_XMM0_Qa,in_RSI,in_RDX);
  if (rperm_1 == (int *)0x0) {
    a = in_RDI[8];
    local_70 = 0;
    for (local_6c = 0; iVar2 = (int)((ulong)in_RSI >> 0x20), local_6c < local_34;
        local_6c = local_6c + 1) {
      iVar2 = local_30[local_6c];
      local_68 = *(undefined8 *)(local_28 + (long)iVar2 * 8);
      bVar1 = isNotZero<double,double>(a,(double)in_RDI);
      if (bVar1) {
        enQueueMax(local_30,&local_70,*(int *)((long)a + (long)iVar2 * 4));
      }
      else {
        *(undefined8 *)(local_28 + (long)iVar2 * 8) = 0;
      }
    }
    local_34 = local_70;
  }
  else {
    local_60 = _j_1;
    local_58 = in_RDI[8];
    local_48 = 0;
    for (local_44 = 0; iVar2 = (int)((ulong)in_RSI >> 0x20), local_44 < local_34;
        local_44 = local_44 + 1) {
      local_4c = local_30[local_44];
      local_40 = *(undefined8 *)(local_28 + (long)local_4c * 8);
      bVar1 = isNotZero<double,double>(in_stack_ffffffffffffff80,(double)in_RDI);
      if (bVar1) {
        *(int *)local_60 = local_4c;
        local_60 = (double *)((long)local_60 + 4);
        enQueueMax(local_30,&local_48,*(int *)((long)local_58 + (long)local_4c * 4));
        *(undefined8 *)(rperm_1 + (long)local_4c * 2) = local_40;
      }
      else {
        *(undefined8 *)(local_28 + (long)local_4c * 8) = 0;
      }
    }
    local_34 = local_48;
    *in_stack_00000010 = local_48;
  }
  local_34 = vSolveUright((CLUFactor<double> *)x_1,_j_1,in_stack_00000010,(double *)rperm_1,
                          (int *)unaff_retaddr,(int)((ulong)vec_00 >> 0x20),(double)in_XMM0_Qa);
  if (*(int *)(in_RDI + 0x14) == 0) {
    local_34 = vSolveUpdateRight(unaff_retaddr,vec_00,in_XMM0_Qa,iVar2,in_RDX);
  }
  return local_34;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}